

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O1

CompiledMethodHeader
Lodtalk::CompiledMethodHeader::create
          (size_t literalCount,size_t temporalCount,size_t argumentCount,size_t extraFlags)

{
  if (0xffff < literalCount) {
    __assert_fail("literalCount <= LiteralMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x2d4,
                  "static CompiledMethodHeader Lodtalk::CompiledMethodHeader::create(size_t, size_t, size_t, size_t)"
                 );
  }
  if (temporalCount < 0x40) {
    if (argumentCount < 0x10) {
      return (CompiledMethodHeader)
             (anon_union_8_4_0eb573b0_for_Oop_0)
             (argumentCount << 0x19 | extraFlags | temporalCount * 0x80000 + literalCount * 2 | 1);
    }
    __assert_fail("argumentCount <= ArgumentMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x2d6,
                  "static CompiledMethodHeader Lodtalk::CompiledMethodHeader::create(size_t, size_t, size_t, size_t)"
                 );
  }
  __assert_fail("temporalCount <= TemporalMask",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x2d5,
                "static CompiledMethodHeader Lodtalk::CompiledMethodHeader::create(size_t, size_t, size_t, size_t)"
               );
}

Assistant:

static CompiledMethodHeader create(size_t literalCount, size_t temporalCount, size_t argumentCount, size_t extraFlags)
	{
		assert(literalCount <= LiteralMask);
		assert(temporalCount <= TemporalMask);
		assert(argumentCount <= ArgumentMask);

		return Oop::fromRawUIntPtr(1 |
		((literalCount & LiteralMask) << LiteralShift) |
		((temporalCount & TemporalMask) << TemporalShift) |
		((argumentCount & ArgumentMask) << ArgumentShift) |
        extraFlags);
	}